

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

int __thiscall Fl_Type::user_defined(Fl_Type *this,char *cbname)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  size_t __n;
  Fl_Type *pFVar2;
  bool bVar3;
  
  bVar3 = first != (Fl_Type *)0x0;
  pFVar2 = first;
  if (bVar3) {
    do {
      iVar1 = (*pFVar2->_vptr_Fl_Type[5])(pFVar2);
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Function");
      if ((iVar1 == 0) && (__s1 = pFVar2->name_, __s1 != (char *)0x0)) {
        __n = strlen(cbname);
        iVar1 = strncmp(__s1,cbname,__n);
        if ((iVar1 == 0) && (__s1[__n] == '(')) break;
      }
      bVar3 = pFVar2->next != (Fl_Type *)0x0;
      pFVar2 = pFVar2->next;
    } while (bVar3);
  }
  return (uint)bVar3;
}

Assistant:

int Fl_Type::user_defined(const char* cbname) const {
  for (Fl_Type* p = Fl_Type::first; p ; p = p->next)
    if (strcmp(p->type_name(), "Function") == 0 && p->name() != 0)
      if (strncmp(p->name(), cbname, strlen(cbname)) == 0)
        if (p->name()[strlen(cbname)] == '(')
          return 1;
  return 0;
}